

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O2

int nn_xreq_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_lb_data *data;
  char *pcVar1;
  undefined8 uStack_30;
  int rcvprio;
  int sndprio;
  size_t sz;
  
  sz = 4;
  nn_pipe_getopt(pipe,0,8,&sndprio,&sz);
  if (sz == 4) {
    if (sndprio - 0x11U < 0xfffffff0) {
      nn_backtrace_print();
      pcVar1 = "sndprio >= 1 && sndprio <= 16";
      uStack_30 = 0x5f;
    }
    else {
      sz = 4;
      nn_pipe_getopt(pipe,0,9,&rcvprio,&sz);
      if (sz == 4) {
        if (0xffffffef < rcvprio - 0x11U) {
          data = (nn_lb_data *)nn_alloc_(0x40);
          if (data != (nn_lb_data *)0x0) {
            nn_pipe_setdata(pipe,data);
            nn_lb_add((nn_lb *)(self + 1),data,pipe,sndprio);
            nn_fq_add((nn_fq *)&self[0x19].sock,(nn_fq_data *)(data + 1),pipe,rcvprio);
            return 0;
          }
          nn_backtrace_print();
          fprintf(_stderr,"Out of memory (%s:%d)\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
                  ,0x67);
          goto LAB_0014d1ff;
        }
        nn_backtrace_print();
        pcVar1 = "rcvprio >= 1 && rcvprio <= 16";
        uStack_30 = 100;
      }
      else {
        nn_backtrace_print();
        pcVar1 = "sz == sizeof (rcvprio)";
        uStack_30 = 99;
      }
    }
  }
  else {
    nn_backtrace_print();
    pcVar1 = "sz == sizeof (sndprio)";
    uStack_30 = 0x5e;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
          ,uStack_30);
LAB_0014d1ff:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_xreq_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xreq *xreq;
    struct nn_xreq_data *data;
    int sndprio;
    int rcvprio;
    size_t sz;

    xreq = nn_cont (self, struct nn_xreq, sockbase);

    sz = sizeof (sndprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_SNDPRIO, &sndprio, &sz);
    nn_assert (sz == sizeof (sndprio));
    nn_assert (sndprio >= 1 && sndprio <= 16);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xreq_data), "pipe data (req)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_lb_add (&xreq->lb, &data->lb, pipe, sndprio);
    nn_fq_add (&xreq->fq, &data->fq, pipe, rcvprio);

    return 0;
}